

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

object_range_type * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
          (object_range_type *__return_storage_ptr__,
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this)

{
  byte bVar1;
  bool bVar2;
  object *poVar3;
  json_runtime_error<std::domain_error,_void> *this_00;
  pointer pkVar4;
  pointer pkVar5;
  string local_38;
  
  for (; bVar1 = (byte)*(object_storage *)this & 0xf, bVar1 == 9;
      this = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> **)
              ((object_storage *)this + 8)) {
  }
  if (bVar1 == 4) {
    pkVar5 = (pointer)0x0;
    bVar2 = false;
    pkVar4 = (pointer)0x0;
  }
  else {
    if (bVar1 != 0xd) {
      this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Not an object","");
      json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_38);
      __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    }
    poVar3 = object_storage::value_abi_cxx11_((object_storage *)this);
    pkVar5 = (poVar3->members_).
             super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    poVar3 = object_storage::value_abi_cxx11_((object_storage *)this);
    pkVar4 = (poVar3->members_).
             super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = true;
  }
  (__return_storage_ptr__->first_).it_._M_current = pkVar5;
  (__return_storage_ptr__->first_).has_value_ = bVar2;
  (__return_storage_ptr__->last_).it_._M_current = pkVar4;
  (__return_storage_ptr__->last_).has_value_ = bVar2;
  return __return_storage_ptr__;
}

Assistant:

object_range_type object_range()
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                    return object_range_type(object_iterator(), object_iterator());
                case json_storage_kind::object:
                    return object_range_type(object_iterator(cast<object_storage>().value().begin()),
                                                  object_iterator(cast<object_storage>().value().end()));
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().object_range();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not an object"));
            }
        }